

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_critical_section_start(void)

{
  atomic_int aVar1;
  
  while( true ) {
    aVar1 = g_state_barrier;
    LOCK();
    g_state_barrier = g_state_barrier + 1;
    UNLOCK();
    if (aVar1 < 1) break;
    LOCK();
    UNLOCK();
    g_state_barrier = aVar1;
    sched_yield();
  }
  return;
}

Assistant:

inline static void ggml_critical_section_start(void) {
    int processing = atomic_fetch_add(&g_state_barrier, 1);

    while (processing > 0) {
        // wait for other threads to finish
        atomic_fetch_sub(&g_state_barrier, 1);
        sched_yield(); // TODO: reconsider this
        processing = atomic_fetch_add(&g_state_barrier, 1);
    }
}